

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int is_cur_buf_hbd(MACROBLOCKD *xd)

{
  MACROBLOCKD *xd_local;
  
  return (uint)((xd->cur_buf->flags & 8U) != 0);
}

Assistant:

static inline int is_cur_buf_hbd(const MACROBLOCKD *xd) {
#if CONFIG_AV1_HIGHBITDEPTH
  return xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH ? 1 : 0;
#else
  (void)xd;
  return 0;
#endif
}